

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_list.c
# Opt level: O2

bool_t prf_vertex_list_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  ulong uVar1;
  uint n_bytes;
  uint16_t uVar2;
  ushort uVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  bool_t bVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar2 = bf_get_uint16_be(bfile);
  node->opcode = uVar2;
  if (uVar2 == prf_vertex_list_info.opcode) {
    uVar3 = bf_get_uint16_be(bfile);
    node->length = uVar3;
    puVar5 = node->data;
    if (puVar5 == (uint8_t *)0x0 && 4 < uVar3) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        puVar5 = (uint8_t *)malloc((ulong)(uVar3 - 4));
      }
      else {
        puVar5 = (uint8_t *)pool_malloc(pool_id,uVar3 - 4);
      }
      node->data = puVar5;
      if (puVar5 == (uint8_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        n_bytes = 4;
        goto LAB_0010bdbd;
      }
      uVar3 = node->length;
    }
    uVar1 = (long)(int)(uVar3 - 4) / 4;
    uVar7 = 0;
    uVar8 = uVar1 & 0xffffffff;
    if ((int)uVar1 < 1) {
      uVar8 = uVar7;
    }
    bVar6 = 1;
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      uVar4 = bf_get_uint32_be(bfile);
      *(uint32_t *)(puVar5 + uVar7 * 4) = uVar4;
    }
  }
  else {
    prf_error(9,"tried vertex list load method on node of type %d.",(ulong)uVar2);
    n_bytes = 2;
LAB_0010bdbd:
    bf_rewind(bfile,n_bytes);
    bVar6 = 0;
  }
  return bVar6;
}

Assistant:

static
bool_t
prf_vertex_list_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int num, count;
    uint32_t * ptr;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_vertex_list_info.opcode ) {
        prf_error( 9, "tried vertex list load method on node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );

    if ( node->length > 4 && node->data == NULL ) { /* not preallocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    ptr = (uint32_t *) node->data;
    num = 0;
    count = (node->length - 4) / 4;
    while ( num < count ) {
        ptr[num] = bf_get_uint32_be( bfile );
        num++;
    }

    return TRUE;
}